

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckColorAvailable(TidyDocImpl *doc,Node *node)

{
  byte *pbVar1;
  TidyTagId TVar2;
  ctmbstr ptVar3;
  
  if ((0xfffffffc < (doc->access).PRIORITYCHK - 4U) && (node->tag != (Dict *)0x0)) {
    TVar2 = node->tag->id;
    if ((int)TVar2 < 0x35) {
      if (TVar2 == TidyTag_APPLET) {
        prvTidyReportAccessWarning(doc,node,0x143);
        return;
      }
      if (TVar2 == TidyTag_IMG) {
        ptVar3 = tidyLocalizedString(0x142);
        pbVar1 = (byte *)((long)&doc->badAccess + 3);
        *pbVar1 = *pbVar1 | 0x80;
        messageNode(doc,TidyAccess,0x142,node,"%s",ptVar3);
        return;
      }
    }
    else {
      if (TVar2 == TidyTag_INPUT) {
        prvTidyReportAccessWarning(doc,node,0x146);
        return;
      }
      if (TVar2 == TidyTag_OBJECT) {
        prvTidyReportAccessWarning(doc,node,0x144);
        return;
      }
      if (TVar2 == TidyTag_SCRIPT) {
        prvTidyReportAccessWarning(doc,node,0x145);
        return;
      }
    }
  }
  return;
}

Assistant:

static void CheckColorAvailable( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        if ( nodeIsIMG(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_IMAGE );

        else if ( nodeIsAPPLET(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_APPLET );

        else if ( nodeIsOBJECT(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_OBJECT );

        else if ( nodeIsSCRIPT(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_SCRIPT );

        else if ( nodeIsINPUT(node) )
            TY_(ReportAccessWarning)( doc, node, INFORMATION_NOT_CONVEYED_INPUT );
    }
}